

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86.cpp
# Opt level: O2

int __thiscall ncnn::InnerProduct_x86::create_pipeline(InnerProduct_x86 *this,Option *opt)

{
  uint _h;
  _func_int *p_Var1;
  _func_int **pp_Var2;
  size_t sVar3;
  void *pvVar4;
  Allocator *pAVar5;
  int *piVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  int _w;
  Layer *pLVar10;
  void *pvVar11;
  _func_int **pp_Var12;
  ulong uVar13;
  long lVar14;
  _func_int **pp_Var15;
  ulong uVar16;
  ulong uVar17;
  ParamDict pd;
  size_t local_60;
  Allocator *local_50;
  int local_44;
  
  pLVar10 = create_layer(0xe);
  this->flatten = pLVar10;
  ParamDict::ParamDict(&pd);
  (*this->flatten->_vptr_Layer[2])(this->flatten,&pd);
  (*this->flatten->_vptr_Layer[4])(this->flatten,opt);
  ParamDict::~ParamDict(&pd);
  if ((opt->use_int8_inference == true) &&
     (*(long *)(&this->field_0x140 + (long)this->_vptr_InnerProduct_x86[-3]) == 1)) {
    create_pipeline_int8_x86(this,opt);
  }
  else {
    iVar9 = cpu_support_x86_f16c();
    if ((iVar9 == 0) || (opt->use_fp16_storage != true)) {
      p_Var1 = this->_vptr_InnerProduct_x86[-3];
      _h = *(uint *)(&this->field_0xd0 + (long)p_Var1);
      iVar9 = *(int *)(&this->field_0xd8 + (long)p_Var1);
      uVar17 = (long)iVar9 / (long)(int)_h;
      if (((_h & 3) == 0) && (opt->use_packing_layout != false)) {
        _w = (int)uVar17;
        uVar16 = 0;
        Mat::reshape((Mat *)&pd,(Mat *)(&this->field_0x130 + (long)p_Var1),_w,_h,(Allocator *)0x0);
        Mat::create(&this->weight_data_tm,_w,
                    *(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86[-3]) / 4,0x10,4,
                    (Allocator *)0x0);
        pp_Var2 = this->_vptr_InnerProduct_x86;
        iVar9 = (this->weight_data_tm).w;
        sVar3 = (this->weight_data_tm).elemsize;
        pvVar4 = (this->weight_data_tm).data;
        uVar17 = uVar17 & 0xffffffff;
        if (_w < 1) {
          uVar17 = uVar16;
        }
        for (; (long)(uVar16 | 3) < (long)*(int *)(&this->field_0xd0 + (long)pp_Var2[-3]);
            uVar16 = uVar16 + 4) {
          pvVar11 = (void *)((uVar16 >> 2 & 0x3fffffff) * (long)iVar9 * sVar3 + (long)pvVar4);
          pp_Var12 = (_func_int **)((long)local_44 * local_60 * uVar16 + (long)pd._vptr_ParamDict);
          for (uVar13 = 0; uVar13 != uVar17; uVar13 = uVar13 + 1) {
            pp_Var15 = pp_Var12;
            for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
              *(undefined4 *)((long)pvVar11 + lVar14) = *(undefined4 *)pp_Var15;
              pp_Var15 = (_func_int **)((long)pp_Var15 + (long)local_44 * local_60);
            }
            pp_Var12 = (_func_int **)((long)pp_Var12 + 4);
            pvVar11 = (void *)((long)pvVar11 + 0x10);
          }
        }
        if (pd.d != (ParamDictPrivate *)0x0) {
          LOCK();
          (pd.d)->params[0].type = (pd.d)->params[0].type + -1;
          UNLOCK();
          if ((pd.d)->params[0].type == 0) {
            if (local_50 == (Allocator *)0x0) {
              free(pd._vptr_ParamDict);
            }
            else {
              (*local_50->_vptr_Allocator[3])();
            }
          }
        }
      }
      else if (p_Var1 != (_func_int *)0xfffffffffffffee0) {
        piVar6 = *(int **)(&this->field_0x138 + (long)p_Var1);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = (this->weight_data_tm).refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            pvVar4 = (this->weight_data_tm).data;
            pAVar5 = (this->weight_data_tm).allocator;
            if (pAVar5 == (Allocator *)0x0) {
              free(pvVar4);
            }
            else {
              (*pAVar5->_vptr_Allocator[3])(pAVar5,pvVar4,(long)iVar9 % (long)(int)_h & 0xffffffff);
            }
          }
        }
        (this->weight_data_tm).cstep = 0;
        *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
        *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
        (this->weight_data_tm).data = (void *)0x0;
        (this->weight_data_tm).refcount = (int *)0x0;
        (this->weight_data_tm).c = 0;
        (this->weight_data_tm).dims = 0;
        (this->weight_data_tm).w = 0;
        (this->weight_data_tm).h = 0;
        (this->weight_data_tm).d = 0;
        piVar6 = *(int **)((long)(&this->field_0x130 + (long)p_Var1) + 8);
        (this->weight_data_tm).data = *(void **)(&this->field_0x130 + (long)p_Var1);
        (this->weight_data_tm).refcount = piVar6;
        (this->weight_data_tm).elemsize = *(size_t *)(&this->field_0x140 + (long)p_Var1);
        (this->weight_data_tm).elempack = *(int *)(&this->field_0x148 + (long)p_Var1);
        (this->weight_data_tm).allocator = *(Allocator **)(&this->field_0x150 + (long)p_Var1);
        uVar7 = *(undefined8 *)(&this->field_0x158 + (long)p_Var1);
        uVar8 = *(undefined8 *)((long)(&this->field_0x158 + (long)p_Var1) + 8);
        (this->weight_data_tm).dims = (int)uVar7;
        (this->weight_data_tm).w = (int)((ulong)uVar7 >> 0x20);
        (this->weight_data_tm).h = (int)uVar8;
        (this->weight_data_tm).d = (int)((ulong)uVar8 >> 0x20);
        (this->weight_data_tm).c = *(int *)(&this->field_0x168 + (long)p_Var1);
        (this->weight_data_tm).cstep = *(size_t *)(&this->field_0x170 + (long)p_Var1);
      }
      if (opt->lightmode == true) {
        p_Var1 = this->_vptr_InnerProduct_x86[-3];
        piVar6 = *(int **)(&this->field_0x138 + (long)p_Var1);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (*(long **)(&this->field_0x150 + (long)p_Var1) == (long *)0x0) {
              free(*(void **)(&this->field_0x130 + (long)p_Var1));
            }
            else {
              (**(code **)(**(long **)(&this->field_0x150 + (long)p_Var1) + 0x18))();
            }
          }
        }
        *(undefined8 *)(&this->field_0x170 + (long)p_Var1) = 0;
        *(undefined8 *)(&this->field_0x13c + (long)p_Var1) = 0;
        *(undefined8 *)(&this->field_0x144 + (long)p_Var1) = 0;
        *(undefined8 *)(&this->field_0x130 + (long)p_Var1) = 0;
        *(undefined8 *)(&this->field_0x138 + (long)p_Var1) = 0;
        *(undefined8 *)(&this->field_0x158 + (long)p_Var1) = 0;
        *(undefined8 *)(&this->field_0x160 + (long)p_Var1) = 0;
        *(undefined4 *)(&this->field_0x168 + (long)p_Var1) = 0;
      }
    }
    else {
      create_pipeline_fp16s(this,opt);
    }
  }
  return 0;
}

Assistant:

int InnerProduct_x86::create_pipeline(const Option& opt)
{
    //     if (opt.use_packing_layout)
    {
        flatten = ncnn::create_layer(ncnn::LayerType::Flatten);

        ncnn::ParamDict pd;

        flatten->load_param(pd);

        flatten->create_pipeline(opt);
    }

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

#if NCNN_F16C
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return create_pipeline_fp16s(opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    if (out_elempack != 1)
    {
        // src = inch-outch
        // dst = pb-inch-outch/pb
        {
            Mat weight_data_r2 = weight_data.reshape(num_input, num_output);

            weight_data_tm.create(num_input, num_output / out_elempack, (size_t)4u * out_elempack, out_elempack);

            for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
            {
                float* g0 = weight_data_tm.row(q / out_elempack);

                for (int p = 0; p < num_input; p++)
                {
                    for (int j = 0; j < out_elempack; j++)
                    {
                        *g0++ = weight_data_r2.row(q + j)[p];
                    }
                }
            }
        }
    }
    else
    {
        weight_data_tm = weight_data;
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}